

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPTimeInitializerObject::RTPTimeInitializerObject(RTPTimeInitializerObject *this)

{
  timespec tpMono;
  timespec tpMono_1;
  timespec local_38;
  timespec local_28;
  
  if (RTPTime::CurrentTime()::s_initialized == '\0') {
    RTPTime::CurrentTime()::s_initialized = '\x01';
    clock_gettime(0,&local_38);
    clock_gettime(1,&local_28);
    RTPTime::CurrentTime()::s_startOffet =
         ((double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec) -
         ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
  }
  else {
    clock_gettime(1,&local_38);
  }
  this->dummy = -1;
  return;
}

Assistant:

RTPTimeInitializerObject::RTPTimeInitializerObject()
{
#ifdef RTPDEBUG
	std::cout << "RTPTimeInitializer: Initializing RTPTime::CurrentTime()" << std::endl;
#endif // RTPDEBUG
	RTPTime curtime = RTPTime::CurrentTime();
	JRTPLIB_UNUSED(curtime);
	dummy = -1;
}